

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGProcessExternalRef(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  void *pvVar2;
  xmlNodePtr node_00;
  xmlChar *pxVar3;
  xmlRelaxNGPtr pxVar4;
  bool bVar5;
  xmlRelaxNGDefinePtr_conflict local_50;
  xmlRelaxNGDefinePtr_conflict def;
  int oldflags;
  int newNs;
  xmlChar *ns;
  xmlNodePtr tmp;
  xmlNodePtr root;
  xmlRelaxNGDocumentPtr_conflict docu;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  bVar5 = false;
  pvVar2 = node->psvi;
  if (pvVar2 == (void *)0x0) {
    local_50 = (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  else {
    local_50 = xmlRelaxNGNewDefine(ctxt,node);
    if (local_50 == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    local_50->type = XML_RELAXNG_EXTERNALREF;
    if (*(long *)((long)pvVar2 + 0x18) == 0) {
      node_00 = xmlDocGetRootElement(*(xmlDoc **)((long)pvVar2 + 0x10));
      if (node_00 == (xmlNodePtr)0x0) {
        xmlRngPErr(ctxt,node,0x407,"xmlRelaxNGParse: %s is empty\n",ctxt->URL,(xmlChar *)0x0);
        return (xmlRelaxNGDefinePtr_conflict)0x0;
      }
      pxVar3 = xmlGetProp(node_00,"ns");
      if (pxVar3 == (xmlChar *)0x0) {
        _oldflags = (xmlChar *)0x0;
        ns = (xmlChar *)node;
        while( true ) {
          bVar5 = false;
          if (ns != (xmlChar *)0x0) {
            bVar5 = *(int *)(ns + 8) == 1;
          }
          if ((!bVar5) || (_oldflags = xmlGetProp((xmlNode *)ns,"ns"), _oldflags != (xmlChar *)0x0))
          break;
          ns = *(xmlChar **)(ns + 0x28);
        }
        bVar5 = _oldflags != (xmlChar *)0x0;
        if (bVar5) {
          xmlSetProp(node_00,"ns",_oldflags);
          (*xmlFree)(_oldflags);
        }
      }
      else {
        (*xmlFree)(pxVar3);
      }
      iVar1 = ctxt->flags;
      ctxt->flags = ctxt->flags | 0x80;
      pxVar4 = xmlRelaxNGParseDocument(ctxt,node_00);
      *(xmlRelaxNGPtr *)((long)pvVar2 + 0x20) = pxVar4;
      ctxt->flags = iVar1;
      if (((*(long *)((long)pvVar2 + 0x20) != 0) &&
          (*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) != 0)) &&
         (*(undefined8 *)((long)pvVar2 + 0x18) =
               *(undefined8 *)(*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) + 0x18),
         *(long *)(*(long *)(*(long *)((long)pvVar2 + 0x20) + 8) + 0x38) != 0)) {
        xmlRelaxNGParseImportRefs
                  (ctxt,*(xmlRelaxNGGrammarPtr_conflict *)(*(long *)((long)pvVar2 + 0x20) + 8));
      }
      if (bVar5) {
        xmlUnsetProp(node_00,"ns");
      }
    }
    local_50->content = *(xmlRelaxNGDefinePtr *)((long)pvVar2 + 0x18);
  }
  return local_50;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGProcessExternalRef(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDocumentPtr docu;
    xmlNodePtr root, tmp;
    xmlChar *ns;
    int newNs = 0, oldflags;
    xmlRelaxNGDefinePtr def;

    docu = node->psvi;
    if (docu != NULL) {
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL)
            return (NULL);
        def->type = XML_RELAXNG_EXTERNALREF;

        if (docu->content == NULL) {
            /*
             * Then do the parsing for good
             */
            root = xmlDocGetRootElement(docu->doc);
            if (root == NULL) {
                xmlRngPErr(ctxt, node, XML_RNGP_EXTERNALREF_EMTPY,
                           "xmlRelaxNGParse: %s is empty\n", ctxt->URL,
                           NULL);
                return (NULL);
            }
            /*
             * ns transmission rules
             */
            ns = xmlGetProp(root, BAD_CAST "ns");
            if (ns == NULL) {
                tmp = node;
                while ((tmp != NULL) && (tmp->type == XML_ELEMENT_NODE)) {
                    ns = xmlGetProp(tmp, BAD_CAST "ns");
                    if (ns != NULL) {
                        break;
                    }
                    tmp = tmp->parent;
                }
                if (ns != NULL) {
                    xmlSetProp(root, BAD_CAST "ns", ns);
                    newNs = 1;
                    xmlFree(ns);
                }
            } else {
                xmlFree(ns);
            }

            /*
             * Parsing to get a precompiled schemas.
             */
            oldflags = ctxt->flags;
            ctxt->flags |= XML_RELAXNG_IN_EXTERNALREF;
            docu->schema = xmlRelaxNGParseDocument(ctxt, root);
            ctxt->flags = oldflags;
            if ((docu->schema != NULL) &&
                (docu->schema->topgrammar != NULL)) {
                docu->content = docu->schema->topgrammar->start;
                if (docu->schema->topgrammar->refs)
                    xmlRelaxNGParseImportRefs(ctxt, docu->schema->topgrammar);
            }

            /*
             * the externalRef may be reused in a different ns context
             */
            if (newNs == 1) {
                xmlUnsetProp(root, BAD_CAST "ns");
            }
        }
        def->content = docu->content;
    } else {
        def = NULL;
    }
    return (def);
}